

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O1

void __thiscall
efsw::DirectorySnapshot::moveFile(DirectorySnapshot *this,string *oldPath,string *newPath)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  pcVar1 = (oldPath->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + oldPath->_M_string_length);
  removeFile(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pcVar1 = (newPath->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + newPath->_M_string_length);
  addFile(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DirectorySnapshot::moveFile( std::string oldPath, std::string newPath ) {
	removeFile( oldPath );
	addFile( newPath );
}